

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# farmhash-c.c
# Opt level: O3

uint64_t farmhash64_uo_with_seeds(char *s,size_t len,uint64_t seed0,uint64_t seed1)

{
  long *plVar1;
  long *plVar2;
  long *plVar3;
  long lVar4;
  uint64_t uVar5;
  long *plVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  long lVar18;
  long lVar19;
  ulong uVar20;
  long lVar21;
  ulong uVar22;
  long lVar23;
  ulong local_60;
  
  if (len < 0x41) {
    uVar5 = farmhash64_na(s,len);
    uVar8 = (uVar5 - seed0 ^ seed1) * -0x622015f714c7d297;
    uVar8 = (uVar8 >> 0x2f ^ seed1 ^ uVar8) * -0x622015f714c7d297;
    uVar5 = (uVar8 >> 0x2f ^ uVar8) * -0x622015f714c7d297;
  }
  else {
    uVar8 = (ulong)((uint)(len - 1) & 0x3f);
    plVar6 = (long *)(s + (len - 1 & 0xffffffffffffffc0));
    if (s + (len - 0x40) != (char *)((uVar8 - 0x3f) + (long)plVar6)) {
      __assert_fail("s + len - 64 == last64",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sonntex[P]smhasher/farmhash-c.c"
                    ,0x1f5,
                    "uint64_t farmhash64_uo_with_seeds(const char *, size_t, uint64_t, uint64_t)");
    }
    lVar21 = seed0 * -0x651e95c4d06fbfb1;
    lVar13 = seed1 * -0x651e95c4d06fbfb1 + 0x71;
    uVar11 = (ulong)(lVar13 * -0x651e95c4d06fbfb1) >> 0x2f ^ lVar13 * -0x651e95c4d06fbfb1;
    local_60 = uVar11 * -0x651e95c4d06fbfb1;
    lVar18 = seed0 + uVar11 * 0x651e95c4d06fbfb1;
    uVar11 = 0;
    lVar7 = (ulong)((uint)lVar18 & 0x82) + 0x9ae16a3b2f90404f;
    lVar9 = 0;
    do {
      plVar1 = (long *)((long)s + 0x18);
      lVar4 = *(long *)((long)s + 0x30);
      lVar23 = *(long *)((long)s + 8);
      uVar15 = (local_60 + *plVar1) * lVar7;
      lVar12 = uVar11 + *(long *)((long)s + 0x38);
      uVar11 = lVar13 + *(long *)((long)s + 0x10);
      uVar22 = lVar21 + *(long *)s + lVar23;
      lVar13 = lVar18 + *(long *)((long)s + 0x38);
      lVar16 = (uVar15 >> 0x20 | uVar15 << 0x20) + lVar12;
      lVar18 = *(long *)s + lVar4 + lVar16 * 9;
      plVar2 = (long *)((long)s + 0x20);
      uVar15 = seed0 + *plVar2;
      lVar19 = (uVar15 >> 0x21 | uVar15 * 0x80000000) + *(long *)((long)s + 0x10);
      plVar3 = (long *)((long)s + 0x28);
      s = (char *)((long)s + 0x40);
      uVar15 = seed1 + lVar23 + *plVar3;
      local_60 = uVar11 >> 0x1d | uVar11 << 0x23;
      lVar13 = lVar13 + lVar19;
      uVar11 = (uVar22 >> 0x1a | uVar22 << 0x26) * 9;
      lVar23 = uVar11 + lVar23;
      lVar21 = lVar23 - lVar13;
      uVar22 = lVar4 + *plVar3 + lVar12 + lVar16 + lVar21;
      seed0 = lVar19 + lVar21;
      lVar9 = (lVar9 + lVar4 ^ uVar11) * 9 + *plVar2;
      lVar21 = lVar23 + uVar22;
      uVar11 = uVar22 >> 0x22 | uVar22 * 0x40000000;
      seed1 = (uVar15 >> 0x1e | uVar15 << 0x22) + *plVar1 + lVar9;
      lVar9 = lVar9 + seed1;
    } while ((long *)s != plVar6);
    uVar17 = seed0 >> 0x14 | seed0 << 0x2c;
    uVar10 = seed1 >> 0x1c | seed1 << 0x24;
    lVar16 = lVar18 * 9 + lVar13;
    uVar14 = lVar13 + lVar16;
    lVar13 = *(long *)((long)plVar6 + (uVar8 - 0x37));
    lVar18 = *(long *)((long)plVar6 + (uVar8 - 0x17));
    lVar4 = *(long *)((long)plVar6 + (uVar8 - 0x2f));
    lVar23 = uVar10 * lVar7 + *(long *)((long)plVar6 + (uVar8 - 0x3f));
    uVar22 = (uVar17 - lVar21) + lVar13 + uVar14;
    uVar20 = lVar13 + lVar4 + lVar23;
    uVar15 = *(ulong *)((long)plVar6 + (uVar8 - 0xf));
    uVar14 = uVar10 ^ uVar15 ^ uVar14;
    uVar22 = uVar11 * 9 ^ (uVar22 >> 0x25 | uVar22 * 0x8000000) * lVar7;
    uVar14 = uVar17 + lVar18 + (uVar14 >> 0x2a | uVar14 << 0x16) * lVar7;
    local_60 = local_60 + lVar9 + uVar8;
    uVar10 = local_60 >> 0x21 | local_60 * 0x80000000;
    lVar13 = *(long *)((long)plVar6 + (uVar8 - 7));
    lVar21 = uVar10 * lVar7;
    lVar12 = uVar11 + lVar21 + *(long *)((long)plVar6 + (uVar8 - 0x1f));
    uVar15 = lVar18 + uVar15 + lVar12;
    uVar11 = lVar4 + uVar14 + lVar13 + lVar12;
    uVar17 = uVar15 + lVar13 ^ uVar14;
    uVar11 = lVar12 + lVar21 + (uVar15 >> 0x2c | uVar15 * 0x100000) +
             (uVar11 >> 0x15 | uVar11 << 0x2b);
    lVar13 = *(long *)((long)plVar6 + (uVar8 - 0x27)) + uVar22;
    uVar8 = lVar9 + uVar8 + lVar23 + lVar13;
    uVar15 = (uVar20 + lVar13 ^ uVar17) * lVar7;
    uVar8 = ((uVar20 >> 0x2c | uVar20 * 0x100000) + lVar23 + uVar14 +
             (uVar8 >> 0x15 | uVar8 << 0x2b) ^ uVar11) * -0x651e95c4d06fbfb1;
    uVar15 = (uVar15 >> 0x2f ^ uVar17 ^ uVar15) * lVar7;
    uVar8 = uVar8 >> 0x2f ^ uVar11 ^ uVar8;
    uVar22 = (uVar8 * -0x41befec400000000 | uVar8 * -0x651e95c4d06fbfb1 >> 0x1e) *
             -0x651e95c4d06fbfb1 ^ uVar22;
    uVar8 = (((uVar15 >> 0x2f ^ uVar15) + uVar10) * lVar7 - lVar16 ^ uVar22) * -0x651e95c4d06fbfb1;
    uVar8 = uVar8 >> 0x2f ^ uVar22 ^ uVar8;
    uVar5 = (uVar8 * 0x5f20809e00000000 | uVar8 * -0x651e95c4d06fbfb1 >> 0x1f) * -0x651e95c4d06fbfb1
    ;
  }
  return uVar5;
}

Assistant:

uint64_t farmhash64_uo_with_seeds(const char *s, size_t len,
                         uint64_t seed0, uint64_t seed1) {
  if (len <= 64) {
    return farmhash64_na_with_seeds(s, len, seed0, seed1);
  }

  // For strings over 64 bytes we loop.  Internal state consists of
  // 64 bytes: u, v, w, x, y, and z.
  uint64_t x = seed0;
  uint64_t y = seed1 * k2 + 113;
  uint64_t z = smix(y * k2) * k2;
  uint128_c_t v = make_uint128_c_t(seed0, seed1);
  uint128_c_t w = make_uint128_c_t(0, 0);
  uint64_t u = x - z;
  x *= k2;
  uint64_t mul = k2 + (u & 0x82);

  // Set end so that after the loop we have 1 to 64 bytes left to process.
  const char* end = s + ((len - 1) / 64) * 64;
  const char* last64 = end + ((len - 1) & 63) - 63;
  assert(s + len - 64 == last64);
  do {
    uint64_t a0 = fetch64(s);
    uint64_t a1 = fetch64(s + 8);
    uint64_t a2 = fetch64(s + 16);
    uint64_t a3 = fetch64(s + 24);
    uint64_t a4 = fetch64(s + 32);
    uint64_t a5 = fetch64(s + 40);
    uint64_t a6 = fetch64(s + 48);
    uint64_t a7 = fetch64(s + 56);
    x += a0 + a1;
    y += a2;
    z += a3;
    v.a += a4;
    v.b += a5 + a1;
    w.a += a6;
    w.b += a7;

    x = ror64(x, 26);
    x *= 9;
    y = ror64(y, 29);
    z *= mul;
    v.a = ror64(v.a, 33);
    v.b = ror64(v.b, 30);
    w.a ^= x;
    w.a *= 9;
    z = ror64(z, 32);
    z += w.b;
    w.b += z;
    z *= 9;
    swap64(&u, &y);

    z += a0 + a6;
    v.a += a2;
    v.b += a3;
    w.a += a4;
    w.b += a5 + a6;
    x += a1;
    y += a7;

    y += v.a;
    v.a += x - y;
    v.b += w.a;
    w.a += v.b;
    w.b += x - y;
    x += w.b;
    w.b = ror64(w.b, 34);
    swap64(&u, &z);
    s += 64;
  } while (s != end);
  // Make s point to the last 64 bytes of input.
  s = last64;
  u *= 9;
  v.b = ror64(v.b, 28);
  v.a = ror64(v.a, 20);
  w.a += ((len - 1) & 63);
  u += y;
  y += u;
  x = ror64(y - x + v.a + fetch64(s + 8), 37) * mul;
  y = ror64(y ^ v.b ^ fetch64(s + 48), 42) * mul;
  x ^= w.b * 9;
  y += v.a + fetch64(s + 40);
  z = ror64(z + w.a, 33) * mul;
  v = weak_farmhash_na_len_32_with_seeds(s, v.b * mul, x + w.a);
  w = weak_farmhash_na_len_32_with_seeds(s + 32, z + w.b, y + fetch64(s + 16));
  return farmhash_uo_h(farmhash_len_16_mul(v.a + x, w.a ^ y, mul) + z - u,
           farmhash_uo_h(v.b + y, w.b + z, k2, 30) ^ x,
           k2,
           31);
}